

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O3

clock_t experiment::randomExperiment(uint cashSize)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  iterator __last;
  ulong uVar1;
  clock_t cVar2;
  clock_t cVar3;
  size_t __i;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2748;
  iterator iStack_2740;
  uint *local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  uVar7 = 0;
  uVar5 = cashSize << 8;
  uVar6 = (ulong)uVar5;
  local_2748._M_current = (uint *)0x0;
  iStack_2740._M_current = (uint *)0x0;
  local_2738 = (uint *)0x0;
  local_2730._M_x[0] = local_2730._M_x[0] & 0xffffffff00000000;
  if (uVar5 != 0) {
    do {
      if (iStack_2740._M_current == local_2738) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2748,iStack_2740,
                   (uint *)&local_2730);
      }
      else {
        *iStack_2740._M_current = uVar7;
        iStack_2740._M_current = iStack_2740._M_current + 1;
      }
      uVar7 = (int)local_2730._M_x[0] + 1;
      local_2730._M_x[0] = CONCAT44(local_2730._M_x[0]._4_4_,uVar7);
    } while (uVar7 < uVar5);
  }
  __last._M_current = iStack_2740._M_current;
  __first._M_current = local_2748._M_current;
  std::random_device::random_device(&local_13a8);
  uVar5 = std::random_device::_M_getval();
  local_2730._M_x[0] = (unsigned_long)uVar5;
  lVar4 = 1;
  uVar1 = local_2730._M_x[0];
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar4);
    local_2730._M_x[lVar4] = uVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2730._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__last._M_current,&local_2730);
  std::random_device::_M_fini();
  for (; uVar6 != 0; uVar6 = uVar6 - 1) {
    rand();
  }
  cVar2 = clock();
  cVar3 = clock();
  if (local_2748._M_current != (uint *)0x0) {
    operator_delete(local_2748._M_current,(long)local_2738 - (long)local_2748._M_current);
  }
  return cVar3 - cVar2;
}

Assistant:

clock_t experiment::randomExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    std::vector<unsigned int> index;
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        index.push_back(i);
    }
    std::shuffle(index.begin(), index.end(), std::mt19937(std::random_device()()));
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA = 0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
        for(unsigned int j = 0; j < cashSize * 256; ++j)
        {
            newA = a[index[j]];
        }
    }
    finish = clock();
    a[0]=newA;
    delete []a;
    return finish - start;
}